

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_split.cpp
# Opt level: O3

bool __thiscall BamTools::SplitTool::SplitToolPrivate::SplitTag(SplitToolPrivate *this)

{
  bool bVar1;
  ostream *poVar2;
  char arrayTagType;
  char tagType;
  BamAlignment al;
  byte local_18b;
  byte local_18a;
  byte local_189;
  BamAlignment local_188;
  
  BamAlignment::BamAlignment(&local_188);
  do {
    do {
      bVar1 = BamReader::GetNextAlignment(&this->m_reader,&local_188);
      if (!bVar1) {
        bVar1 = true;
        goto LAB_0013555e;
      }
      local_18a = 0;
      bVar1 = BamAlignment::GetTagType(&local_188,&this->m_settings->TagToSplit,(char *)&local_18a);
    } while (!bVar1);
    if (local_18a != 0x42) {
      if (local_18a < 0x5a) {
        switch(local_18a) {
        case 0x41:
        case 0x48:
switchD_00135441_caseD_41:
          bVar1 = SplitTagImpl<std::__cxx11::string>(this,&local_188);
          goto LAB_0013555e;
        case 0x42:
        case 0x44:
        case 0x45:
        case 0x46:
        case 0x47:
          break;
        case 0x43:
          bVar1 = SplitTagImpl<unsigned_char>(this,&local_188);
          goto LAB_0013555e;
        case 0x49:
          bVar1 = SplitTagImpl<unsigned_int>(this,&local_188);
          goto LAB_0013555e;
        default:
          if (local_18a == 0x53) {
            bVar1 = SplitTagImpl<unsigned_short>(this,&local_188);
            goto LAB_0013555e;
          }
        }
      }
      else if (local_18a < 0x66) {
        if (local_18a == 0x5a) goto switchD_00135441_caseD_41;
        if (local_18a == 99) {
          bVar1 = SplitTagImpl<signed_char>(this,&local_188);
          goto LAB_0013555e;
        }
      }
      else {
        if (local_18a == 0x66) {
          bVar1 = SplitTagImpl<float>(this,&local_188);
          goto LAB_0013555e;
        }
        if (local_18a == 0x69) {
          bVar1 = SplitTagImpl<int>(this,&local_188);
          goto LAB_0013555e;
        }
        if (local_18a == 0x73) {
          bVar1 = SplitTagImpl<short>(this,&local_188);
          goto LAB_0013555e;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"bamtools split ERROR: unknown tag type encountered: ",0x34);
      local_189 = local_18a;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)&local_189,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      goto LAB_0013553c;
    }
    local_18b = 0;
    bVar1 = BamAlignment::GetArrayTagType
                      (&local_188,&this->m_settings->TagToSplit,(char *)&local_18b);
  } while (!bVar1);
  if (local_18b < 99) {
    if (local_18b == 0x43) {
      bVar1 = SplitListTagImpl<unsigned_char>(this,&local_188);
      goto LAB_0013555e;
    }
    if (local_18b == 0x49) {
      bVar1 = SplitListTagImpl<unsigned_int>(this,&local_188);
      goto LAB_0013555e;
    }
    if (local_18b == 0x53) {
      bVar1 = SplitListTagImpl<unsigned_short>(this,&local_188);
      goto LAB_0013555e;
    }
  }
  else if (local_18b < 0x69) {
    if (local_18b == 99) {
      bVar1 = SplitListTagImpl<signed_char>(this,&local_188);
      goto LAB_0013555e;
    }
    if (local_18b == 0x66) {
      bVar1 = SplitListTagImpl<float>(this,&local_188);
      goto LAB_0013555e;
    }
  }
  else {
    if (local_18b == 0x69) {
      bVar1 = SplitListTagImpl<int>(this,&local_188);
      goto LAB_0013555e;
    }
    if (local_18b == 0x73) {
      bVar1 = SplitListTagImpl<short>(this,&local_188);
      goto LAB_0013555e;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"bamtools split ERROR: array tag has unsupported element type: ",
             0x3e);
  local_189 = local_18b;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)&local_189,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
LAB_0013553c:
  bVar1 = false;
LAB_0013555e:
  BamAlignment::~BamAlignment(&local_188);
  return bVar1;
}

Assistant:

bool SplitTool::SplitToolPrivate::SplitTag()
{

    // iterate through alignments, until we hit TAG
    BamAlignment al;
    while (m_reader.GetNextAlignment(al)) {

        // look for tag in this alignment and get tag type
        char tagType(0);
        if (!al.GetTagType(m_settings->TagToSplit, tagType)) {
            continue;
        }

        // request split method based on tag type
        // pass it the current alignment found
        switch (tagType) {

            case (Constants::BAM_TAG_TYPE_INT8):
                return SplitTagImpl<int8_t>(al);
            case (Constants::BAM_TAG_TYPE_INT16):
                return SplitTagImpl<int16_t>(al);
            case (Constants::BAM_TAG_TYPE_INT32):
                return SplitTagImpl<int32_t>(al);
            case (Constants::BAM_TAG_TYPE_UINT8):
                return SplitTagImpl<uint8_t>(al);
            case (Constants::BAM_TAG_TYPE_UINT16):
                return SplitTagImpl<uint16_t>(al);
            case (Constants::BAM_TAG_TYPE_UINT32):
                return SplitTagImpl<uint32_t>(al);
            case (Constants::BAM_TAG_TYPE_FLOAT):
                return SplitTagImpl<float>(al);

            case (Constants::BAM_TAG_TYPE_ASCII):
            case (Constants::BAM_TAG_TYPE_STRING):
            case (Constants::BAM_TAG_TYPE_HEX):
                return SplitTagImpl<std::string>(al);

            case (Constants::BAM_TAG_TYPE_ARRAY): {

                char arrayTagType(0);
                if (!al.GetArrayTagType(m_settings->TagToSplit, arrayTagType)) {
                    continue;
                }
                switch (arrayTagType) {
                    case (Constants::BAM_TAG_TYPE_INT8):
                        return SplitListTagImpl<int8_t>(al);
                    case (Constants::BAM_TAG_TYPE_INT16):
                        return SplitListTagImpl<int16_t>(al);
                    case (Constants::BAM_TAG_TYPE_INT32):
                        return SplitListTagImpl<int32_t>(al);
                    case (Constants::BAM_TAG_TYPE_UINT8):
                        return SplitListTagImpl<uint8_t>(al);
                    case (Constants::BAM_TAG_TYPE_UINT16):
                        return SplitListTagImpl<uint16_t>(al);
                    case (Constants::BAM_TAG_TYPE_UINT32):
                        return SplitListTagImpl<uint32_t>(al);
                    case (Constants::BAM_TAG_TYPE_FLOAT):
                        return SplitListTagImpl<float>(al);
                    default:
                        std::cerr
                            << "bamtools split ERROR: array tag has unsupported element type: "
                            << arrayTagType << std::endl;
                        return false;
                }
            }

            default:
                std::cerr << "bamtools split ERROR: unknown tag type encountered: " << tagType
                          << std::endl;
                return false;
        }
    }

    // tag not found, but that's not an error - return success
    return true;
}